

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O1

bool __thiscall
google::protobuf::compiler::CommandLineInterface::WriteDescriptorSet
          (CommandLineInterface *this,
          vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
          *parsed_files)

{
  const_iterator __position;
  FileDescriptor **ppFVar1;
  FileDescriptor *this_00;
  _Base_ptr p_Var2;
  bool bVar3;
  pointer ppFVar4;
  int *piVar5;
  ostream *poVar6;
  char *pcVar7;
  size_t sVar8;
  const_iterator cVar9;
  const_iterator cVar10;
  bool bVar11;
  int iVar12;
  FileDescriptor **__v;
  ulong uVar13;
  _Alloc_node __an;
  FileOutputStream out;
  set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  already_seen;
  FileDescriptorSet file_set;
  _Alloc_node local_f0;
  CommandLineInterface *local_e8;
  undefined1 local_e0 [16];
  _Base_ptr local_d0;
  _Base_ptr local_c8;
  ZeroCopyOutputStream local_c0;
  CopyingOutputStream *local_b8;
  _Rb_tree<const_google::protobuf::FileDescriptor_*,_const_google::protobuf::FileDescriptor_*,_std::_Identity<const_google::protobuf::FileDescriptor_*>,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  local_90;
  FileDescriptorSet local_60;
  
  FileDescriptorSet::FileDescriptorSet(&local_60);
  local_90._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_90._M_impl.super__Rb_tree_header._M_header;
  local_90._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_90._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_90._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_90._M_impl.super__Rb_tree_header._M_header._M_right =
       local_90._M_impl.super__Rb_tree_header._M_header._M_left;
  if (this->imports_in_descriptor_set_ == false) {
    __position._M_node = (_Base_ptr)(local_e0 + 8);
    local_e0._8_4_ = _S_red;
    local_d0 = (_Base_ptr)0x0;
    local_b8 = (CopyingOutputStream *)0x0;
    __v = (parsed_files->
          super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
          )._M_impl.super__Vector_impl_data._M_start;
    ppFVar1 = (parsed_files->
              super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    local_f0._M_t =
         (_Rb_tree<const_google::protobuf::FileDescriptor_*,_const_google::protobuf::FileDescriptor_*,_std::_Identity<const_google::protobuf::FileDescriptor_*>,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
          *)local_e0;
    local_c8 = __position._M_node;
    local_c0._vptr_ZeroCopyOutputStream = (_func_int **)__position._M_node;
    if (__v != ppFVar1) {
      do {
        std::
        _Rb_tree<google::protobuf::FileDescriptor_const*,google::protobuf::FileDescriptor_const*,std::_Identity<google::protobuf::FileDescriptor_const*>,std::less<google::protobuf::FileDescriptor_const*>,std::allocator<google::protobuf::FileDescriptor_const*>>
        ::
        _M_insert_unique_<google::protobuf::FileDescriptor_const*const&,std::_Rb_tree<google::protobuf::FileDescriptor_const*,google::protobuf::FileDescriptor_const*,std::_Identity<google::protobuf::FileDescriptor_const*>,std::less<google::protobuf::FileDescriptor_const*>,std::allocator<google::protobuf::FileDescriptor_const*>>::_Alloc_node>
                  ((_Rb_tree<google::protobuf::FileDescriptor_const*,google::protobuf::FileDescriptor_const*,std::_Identity<google::protobuf::FileDescriptor_const*>,std::less<google::protobuf::FileDescriptor_const*>,std::allocator<google::protobuf::FileDescriptor_const*>>
                    *)local_e0,__position,__v,&local_f0);
        __v = __v + 1;
      } while (__v != ppFVar1);
    }
    ppFVar4 = (parsed_files->
              super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
              )._M_impl.super__Vector_impl_data._M_start;
    local_e8 = this;
    if ((parsed_files->
        super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
        )._M_impl.super__Vector_impl_data._M_finish != ppFVar4) {
      uVar13 = 0;
      do {
        this_00 = ppFVar4[uVar13];
        if (0 < *(int *)(this_00 + 0x18)) {
          iVar12 = 0;
          do {
            local_f0._M_t =
                 (_Rb_tree<const_google::protobuf::FileDescriptor_*,_const_google::protobuf::FileDescriptor_*,_std::_Identity<const_google::protobuf::FileDescriptor_*>,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                  *)FileDescriptor::dependency(this_00,iVar12);
            cVar9._M_node = __position._M_node;
            for (p_Var2 = local_d0; p_Var2 != (_Base_ptr)0x0;
                p_Var2 = (&p_Var2->_M_left)[*(FileDescriptor **)(p_Var2 + 1) < local_f0._M_t]) {
              if (*(FileDescriptor **)(p_Var2 + 1) >= local_f0._M_t) {
                cVar9._M_node = p_Var2;
              }
            }
            cVar10._M_node = __position._M_node;
            if ((cVar9._M_node != __position._M_node) &&
               (cVar10._M_node = cVar9._M_node,
               local_f0._M_t < *(FileDescriptor **)(cVar9._M_node + 1))) {
              cVar10._M_node = __position._M_node;
            }
            if (cVar10._M_node == __position._M_node) {
              std::
              _Rb_tree<google::protobuf::FileDescriptor_const*,google::protobuf::FileDescriptor_const*,std::_Identity<google::protobuf::FileDescriptor_const*>,std::less<google::protobuf::FileDescriptor_const*>,std::allocator<google::protobuf::FileDescriptor_const*>>
              ::_M_insert_unique<google::protobuf::FileDescriptor_const*const&>
                        ((_Rb_tree<google::protobuf::FileDescriptor_const*,google::protobuf::FileDescriptor_const*,std::_Identity<google::protobuf::FileDescriptor_const*>,std::less<google::protobuf::FileDescriptor_const*>,std::allocator<google::protobuf::FileDescriptor_const*>>
                          *)&local_90,(FileDescriptor **)&local_f0);
            }
            iVar12 = iVar12 + 1;
          } while (iVar12 < *(int *)(this_00 + 0x18));
        }
        uVar13 = uVar13 + 1;
        ppFVar4 = (parsed_files->
                  super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                  )._M_impl.super__Vector_impl_data._M_start;
      } while (uVar13 < (ulong)((long)(parsed_files->
                                      super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                                      )._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar4 >>
                               3));
    }
    std::
    _Rb_tree<const_google::protobuf::FileDescriptor_*,_const_google::protobuf::FileDescriptor_*,_std::_Identity<const_google::protobuf::FileDescriptor_*>,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
    ::~_Rb_tree((_Rb_tree<const_google::protobuf::FileDescriptor_*,_const_google::protobuf::FileDescriptor_*,_std::_Identity<const_google::protobuf::FileDescriptor_*>,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                 *)local_e0);
    this = local_e8;
  }
  ppFVar4 = (parsed_files->
            super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if ((parsed_files->
      super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
      )._M_impl.super__Vector_impl_data._M_finish != ppFVar4) {
    uVar13 = 0;
    do {
      GetTransitiveDependencies
                (ppFVar4[uVar13],true,this->source_info_in_descriptor_set_,
                 (set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                  *)&local_90,&local_60.file_);
      uVar13 = uVar13 + 1;
      ppFVar4 = (parsed_files->
                super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                )._M_impl.super__Vector_impl_data._M_start;
    } while (uVar13 < (ulong)((long)(parsed_files->
                                    super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar4 >> 3
                             ));
  }
  do {
    iVar12 = open((this->descriptor_set_name_)._M_dataplus._M_p,0x241,0x1b6);
    if (-1 < iVar12) {
      io::FileOutputStream::FileOutputStream((FileOutputStream *)local_e0,iVar12,-1);
      bVar3 = MessageLite::SerializeToZeroCopyStream
                        ((MessageLite *)&local_60,(ZeroCopyOutputStream *)local_e0);
      if (bVar3) {
        bVar3 = io::FileOutputStream::Close((FileOutputStream *)local_e0);
        bVar11 = true;
        if (!bVar3) {
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cerr,(this->descriptor_set_name_)._M_dataplus._M_p,
                              (this->descriptor_set_name_)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,": ",2);
          pcVar7 = strerror((int)local_c8);
          if (pcVar7 == (char *)0x0) {
            std::ios::clear((int)poVar6 + (int)*(undefined8 *)(*(long *)poVar6 + -0x18));
          }
          else {
            sVar8 = strlen(pcVar7);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar7,sVar8);
          }
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
          std::ostream::put((char)poVar6);
          std::ostream::flush();
          goto LAB_00207359;
        }
      }
      else {
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,(this->descriptor_set_name_)._M_dataplus._M_p,
                            (this->descriptor_set_name_)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,": ",2);
        pcVar7 = strerror((int)local_c8);
        if (pcVar7 == (char *)0x0) {
          std::ios::clear((int)poVar6 + (int)*(undefined8 *)(*(long *)poVar6 + -0x18));
        }
        else {
          sVar8 = strlen(pcVar7);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar7,sVar8);
        }
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
        std::ostream::put((char)poVar6);
        std::ostream::flush();
        io::FileOutputStream::Close((FileOutputStream *)local_e0);
LAB_00207359:
        bVar11 = false;
      }
      io::FileOutputStream::~FileOutputStream((FileOutputStream *)local_e0);
      goto LAB_00207365;
    }
    piVar5 = __errno_location();
  } while (*piVar5 == 4);
  perror((this->descriptor_set_name_)._M_dataplus._M_p);
  bVar11 = false;
LAB_00207365:
  std::
  _Rb_tree<const_google::protobuf::FileDescriptor_*,_const_google::protobuf::FileDescriptor_*,_std::_Identity<const_google::protobuf::FileDescriptor_*>,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  ::~_Rb_tree(&local_90);
  FileDescriptorSet::~FileDescriptorSet(&local_60);
  return bVar11;
}

Assistant:

bool CommandLineInterface::WriteDescriptorSet(
    const std::vector<const FileDescriptor*>& parsed_files) {
  FileDescriptorSet file_set;

  std::set<const FileDescriptor*> already_seen;
  if (!imports_in_descriptor_set_) {
    // Since we don't want to output transitive dependencies, but we do want
    // things to be in dependency order, add all dependencies that aren't in
    // parsed_files to already_seen.  This will short circuit the recursion
    // in GetTransitiveDependencies.
    std::set<const FileDescriptor*> to_output;
    to_output.insert(parsed_files.begin(), parsed_files.end());
    for (int i = 0; i < parsed_files.size(); i++) {
      const FileDescriptor* file = parsed_files[i];
      for (int i = 0; i < file->dependency_count(); i++) {
        const FileDescriptor* dependency = file->dependency(i);
        // if the dependency isn't in parsed files, mark it as already seen
        if (to_output.find(dependency) == to_output.end()) {
          already_seen.insert(dependency);
        }
      }
    }
  }
  for (int i = 0; i < parsed_files.size(); i++) {
    GetTransitiveDependencies(parsed_files[i],
                              true,  // Include json_name
                              source_info_in_descriptor_set_,
                              &already_seen, file_set.mutable_file());
  }

  int fd;
  do {
    fd = open(descriptor_set_name_.c_str(),
              O_WRONLY | O_CREAT | O_TRUNC | O_BINARY, 0666);
  } while (fd < 0 && errno == EINTR);

  if (fd < 0) {
    perror(descriptor_set_name_.c_str());
    return false;
  }

  io::FileOutputStream out(fd);
  if (!file_set.SerializeToZeroCopyStream(&out)) {
    std::cerr << descriptor_set_name_ << ": " << strerror(out.GetErrno())
              << std::endl;
    out.Close();
    return false;
  }
  if (!out.Close()) {
    std::cerr << descriptor_set_name_ << ": " << strerror(out.GetErrno())
              << std::endl;
    return false;
  }

  return true;
}